

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

QRgba64 __thiscall QColorTransform::map(QColorTransform *this,QRgba64 rgba64)

{
  bool bVar1;
  quint16 qVar2;
  quint16 qVar3;
  quint16 qVar4;
  quint64 in_RSI;
  long in_FS_OFFSET;
  QColorVector QVar5;
  float f;
  QColorVector c;
  undefined1 in_stack_00000090 [16];
  undefined8 in_stack_ffffffffffffff78;
  undefined1 local_28 [8];
  QColorTransformPrivate *pQStack_20;
  QRgba64 local_18;
  quint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.rgba = in_RSI;
  bVar1 = QExplicitlySharedDataPointer<QColorTransformPrivate>::operator!
                    ((QExplicitlySharedDataPointer<QColorTransformPrivate> *)0x4c6a95);
  if (bVar1) {
    local_10 = local_18.rgba;
  }
  else {
    local_28._0_4_ = -NAN;
    local_28._4_4_ = -NAN;
    pQStack_20 = (QColorTransformPrivate *)0xffffffffffffffff;
    qVar2 = QRgba64::red(&local_18);
    qVar3 = QRgba64::green(&local_18);
    qVar4 = QRgba64::blue(&local_18);
    QColorVector::QColorVector
              ((QColorVector *)local_28,(float)qVar2 * 1.5259022e-05,(float)qVar3 * 1.5259022e-05,
               (float)qVar4 * 1.5259022e-05,0.0);
    QExplicitlySharedDataPointer<QColorTransformPrivate>::operator->
              ((QExplicitlySharedDataPointer<QColorTransformPrivate> *)0x4c6b4b);
    QVar5 = QColorTransformPrivate::map(pQStack_20,(QColorVector)in_stack_00000090);
    pQStack_20 = QVar5._8_8_;
    local_28 = QVar5._0_8_;
    QRgba64::alpha(&local_18);
    local_10 = (quint64)QRgba64::fromRgba64((quint16)((ulong)in_stack_ffffffffffffff78 >> 0x30),
                                            (quint16)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                            (quint16)((ulong)in_stack_ffffffffffffff78 >> 0x10),
                                            (quint16)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRgba64)local_10;
  }
  __stack_chk_fail();
}

Assistant:

QRgba64 QColorTransform::map(QRgba64 rgba64) const
{
    if (!d)
        return rgba64;
    constexpr float f = 1.0f / 65535.0f;
    QColorVector c = { rgba64.red() * f, rgba64.green() * f, rgba64.blue() * f };
    c = d->map(c);
    return QRgba64::fromRgba64(c.x * 65535.f + 0.5f, c.y * 65535.f + 0.5f, c.z * 65535.f + 0.5f, rgba64.alpha());
}